

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::AccessorEnumFieldGenerator::GenerateMergingCode
          (AccessorEnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,"int value = input.readInt32();\nswitch (value) {\n")
  ;
  anon_unknown_3::PrintCaseLabels(printer,&this->canonical_values_);
  io::Printer::Print(printer,&this->variables_,
                     "    $name$_ = value;\n    $set_has$;\n    break;\n}\n");
  return;
}

Assistant:

void AccessorEnumFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "int value = input.readInt32();\n"
    "switch (value) {\n");
  PrintCaseLabels(printer, canonical_values_);
  printer->Print(variables_,
    "    $name$_ = value;\n"
    "    $set_has$;\n"
    "    break;\n"
    "}\n");
  // No default case: in case of invalid value from the wire, preserve old
  // field value. Also we are not storing the invalid value into the unknown
  // fields, because there is no way to get the value out.
}